

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> * __thiscall
wasm::WATParser::anon_unknown_10::hexnum
          (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in,OverflowBehavior overflow)

{
  bool bVar1;
  size_t sVar2;
  anon_unknown_10 *extraout_RDX;
  undefined1 auVar3 [8];
  uint64_t uVar4;
  anon_unknown_10 *paVar6;
  bool bVar7;
  string_view sv;
  undefined1 local_70 [8];
  LexIntCtx ctx;
  char *local_40;
  Sign local_34;
  char *pcVar5;
  
  ctx.super_LexCtx.input._M_len = in._M_len;
  ctx._36_4_ = in._M_str._0_4_;
  ctx.super_LexCtx.input._M_str = (char *)0x0;
  ctx.super_LexCtx.lexedSize._0_5_ = 0;
  ctx.super_LexCtx.lexedSize._5_3_ = 0;
  ctx.n._0_4_ = NoSign;
  ctx.n._4_1_ = '\0';
  local_70 = (undefined1  [8])this;
  bVar1 = LexIntCtx::takeHexdigit((LexIntCtx *)local_70);
  if (bVar1) {
    local_40 = (__return_storage_ptr__->
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
               )._M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
               _M_payload._M_value.super_LexResult.span._M_str;
    uVar4 = (__return_storage_ptr__->
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
            _M_payload._M_value.n;
    local_34 = (__return_storage_ptr__->
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
               )._M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
               _M_payload._M_value.sign;
    paVar6 = (anon_unknown_10 *)
             (__return_storage_ptr__->
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>)
             ._M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
             _M_payload._M_value.super_LexResult.span._M_len;
    do {
      do {
        sv._M_str = "_";
        sv._M_len = 1;
        pcVar5 = (char *)0x1;
        sVar2 = LexCtx::startsWith((LexCtx *)local_70,sv);
        if (sVar2 != 0) {
          ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
        }
        bVar1 = LexIntCtx::takeHexdigit((LexIntCtx *)local_70);
      } while (bVar1);
      if (sVar2 == 0) {
        if (ctx._36_4_ == 0) {
          if (ctx.n._4_1_ == '\0') {
            auVar3 = (undefined1  [8])extraout_RDX;
            if (ctx.super_LexCtx.input._M_str != (char *)0x0) {
              auVar3 = local_70;
              pcVar5 = (char *)ctx.super_LexCtx.input._M_len;
              if (ctx.super_LexCtx.input._M_str <= (ulong)local_70) {
                auVar3 = (undefined1  [8])ctx.super_LexCtx.input._M_str;
              }
            }
            if (ctx.super_LexCtx.input._M_str != (char *)0x0) {
              local_34 = (Sign)ctx.n;
              uVar4 = -CONCAT35(ctx.super_LexCtx.lexedSize._5_3_,
                                (undefined5)ctx.super_LexCtx.lexedSize);
              if ((Sign)ctx.n != Neg) {
                uVar4 = CONCAT35(ctx.super_LexCtx.lexedSize._5_3_,
                                 (undefined5)ctx.super_LexCtx.lexedSize);
              }
              bVar7 = true;
              local_40 = pcVar5;
              goto LAB_009f297b;
            }
          }
          goto LAB_009f2946;
        }
        auVar3 = (undefined1  [8])paVar6;
        if (ctx.super_LexCtx.input._M_str != (char *)0x0) {
          local_40 = (char *)ctx.super_LexCtx.input._M_len;
          auVar3 = local_70;
          if (ctx.super_LexCtx.input._M_str <= (ulong)local_70) {
            auVar3 = (undefined1  [8])ctx.super_LexCtx.input._M_str;
          }
          uVar4 = 0;
          local_34 = NoSign;
        }
        bVar7 = ctx.super_LexCtx.input._M_str != (char *)0x0;
      }
      else {
LAB_009f2946:
        bVar7 = false;
        auVar3 = (undefined1  [8])paVar6;
      }
LAB_009f297b:
      paVar6 = (anon_unknown_10 *)auVar3;
    } while (bVar1);
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_engaged = bVar7;
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.super_LexResult.span._M_str = local_40;
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.n = uVar4;
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.sign = local_34;
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.super_LexResult.span._M_len = (size_t)auVar3;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexIntResult>
hexnum(std::string_view in, OverflowBehavior overflow = DisallowOverflow) {
  LexIntCtx ctx(in);
  if (!ctx.takeHexdigit()) {
    return {};
  }
  while (true) {
    bool under = ctx.takePrefix("_"sv);
    if (!ctx.takeHexdigit()) {
      if (!under) {
        return overflow == DisallowOverflow ? ctx.lexed() : ctx.lexedRaw();
      }
      // TODO: Add error production for trailing underscore.
      return {};
    }
  }
}